

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# E.h
# Opt level: O0

void __thiscall E::Print(E *this)

{
  ostream *poVar1;
  long in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"ERROR: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Print() const 
        { std::cout << "ERROR: "<< _m_error << std::endl;}